

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double_cast_operator.hpp
# Opt level: O1

bool duckdb::TryDoubleCast<float>
               (char *buf,idx_t len,float *result,bool strict,char decimal_separator)

{
  byte bVar1;
  byte *pbVar2;
  byte *last;
  from_chars_result fVar3;
  
  if (len != 0) {
    do {
      bVar1 = *buf;
      if ((4 < bVar1 - 9) && (bVar1 != 0x20)) {
        last = (byte *)buf + len;
        fVar3 = duckdb_fast_float::from_chars<float>
                          ((char *)((byte *)buf + (bVar1 == 0x2b)),(char *)last,result,false,strict,
                           general);
        pbVar2 = (byte *)fVar3.ptr;
        if (fVar3.ec != 0) {
          return false;
        }
        for (; (pbVar2 < last && ((*pbVar2 - 9 < 5 || (*pbVar2 == 0x20)))); pbVar2 = pbVar2 + 1) {
        }
        return pbVar2 == last;
      }
      buf = (char *)((byte *)buf + 1);
      len = len - 1;
    } while (len != 0);
  }
  return false;
}

Assistant:

static bool TryDoubleCast(const char *buf, idx_t len, T &result, bool strict, char decimal_separator = '.') {
	// skip any spaces at the start
	while (len > 0 && StringUtil::CharacterIsSpace(*buf)) {
		buf++;
		len--;
	}
	if (len == 0) {
		return false;
	}
	if (*buf == '+') {
		if (strict) {
			// plus is not allowed in strict mode
			return false;
		}
		buf++;
		len--;
	}
	if (strict && len >= 2) {
		if (buf[0] == '0' && StringUtil::CharacterIsDigit(buf[1])) {
			// leading zeros are not allowed in strict mode
			return false;
		}
	}
	auto endptr = buf + len;
	auto parse_result = duckdb_fast_float::from_chars(buf, buf + len, result, strict, decimal_separator);
	if (parse_result.ec != std::errc()) {
		return false;
	}
	auto current_end = parse_result.ptr;
	if (!strict) {
		while (current_end < endptr && StringUtil::CharacterIsSpace(*current_end)) {
			current_end++;
		}
	}
	return current_end == endptr;
}